

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O2

uint32_t trico_get_number_of_colors(void *a)

{
  uint32_t uVar1;
  uint uVar2;
  uint64_t in_RDX;
  trico_archive *arch;
  uint32_t nr_colors;
  undefined8 uStack_8;
  
  uVar2 = *(int *)((long)a + 0x24) - 0xd;
  uVar1 = 0;
  if (uVar2 < 2) {
    uStack_8 = 0;
    uVar1 = read_inplace((void *)((long)&uStack_8 + 4),(uint64_t)a,in_RDX,
                         (trico_archive *)(ulong)uVar2);
    if (uVar1 != 0) {
      uVar1 = uStack_8._4_4_;
    }
  }
  return uVar1;
}

Assistant:

uint32_t trico_get_number_of_colors(void* a)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (arch->next_stream_type == trico_vertex_color_stream || arch->next_stream_type == trico_triangle_color_stream)
    {
    uint32_t nr_colors;
    if (!read_inplace(&nr_colors, sizeof(uint32_t), 1, arch))
      return 0;
    return nr_colors;
    }
  return 0;
  }